

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_hostbased_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase,char *host,uint host_len,char *localuser,uint localuser_len)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  char *passphrase_local;
  char *privatekey_local;
  char *publickey_local;
  uint user_len_local;
  char *user_local;
  LIBSSH2_SESSION *session_local;
  
  start_time = time((time_t *)0x0);
  do {
    iVar1 = userauth_hostbased_fromfile
                      (session,user,(ulong)user_len,publickey,privatekey,passphrase,host,
                       (ulong)host_len,localuser,(ulong)localuser_len);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar1 = _libssh2_wait_socket(session,start_time);
  } while (iVar1 == 0);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_hostbased_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase,
                                       const char *host,
                                       unsigned int host_len,
                                       const char *localuser,
                                       unsigned int localuser_len)
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_hostbased_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase, host, host_len,
                                             localuser, localuser_len));
    return rc;
}